

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

Gia_Man_t * Gia_ManFOFUnfold(Gia_Man_t *p,Vec_Int_t *vMap)

{
  char *__s;
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *__dest;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  uint iData0;
  uint uVar12;
  Gia_Obj_t *pObj_1;
  long lVar13;
  uint uVar14;
  Gia_Obj_t *pObj;
  long lVar15;
  uint uVar16;
  uint uVar17;
  Gia_Obj_t *pObj_2;
  uint local_6c;
  
  iVar11 = p->nObjs;
  iVar5 = p->vCos->nSize;
  iVar6 = p->vCis->nSize;
  p_00 = Gia_ManStart(iVar11 * 9);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar7 = strlen(__s);
    __dest = (char *)malloc(sVar7 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  if (0 < pVVar9->nSize) {
    lVar15 = 0;
    do {
      iVar4 = pVVar9->pArray[lVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00595903;
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar2 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar2 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
      pGVar1[iVar4].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar9 = p->vCis;
    } while (lVar15 < pVVar9->nSize);
  }
  iVar4 = p->nObjs;
  if (iVar4 < 1) {
    uVar12 = 0;
  }
  else {
    iVar11 = (iVar11 + ~(iVar5 + iVar6)) * 4;
    lVar13 = 0;
    lVar15 = 8;
    uVar12 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      uVar16 = *(uint *)((long)pGVar1 + lVar15 + -8);
      if ((~uVar16 & 0x1fffffff) != 0 && -1 < (int)uVar16) {
        if (((int)uVar12 < 0) || (vMap->nSize <= (int)uVar12)) {
LAB_00595922:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar16 = uVar12 + 1;
        iVar5 = vMap->pArray[uVar12];
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar2 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar2 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((iVar5 == 0) || (iVar11 <= (int)uVar16)) {
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          if ((pGVar8 < p_00->pObjs) || (iData0 = 0, p_00->pObjs + p_00->nObjs <= pGVar8))
          goto LAB_005958e4;
        }
        else {
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_005958e4:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = p_00->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          iData0 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)uVar16) goto LAB_00595922;
        uVar17 = uVar12 + 2;
        iVar5 = vMap->pArray[uVar16];
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar2 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar2 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((iVar5 == 0) || (iVar11 <= (int)uVar17)) {
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          if ((pGVar8 < p_00->pObjs) || (uVar16 = 0, p_00->pObjs + p_00->nObjs <= pGVar8))
          goto LAB_005958e4;
        }
        else {
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = p_00->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          uVar16 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)uVar17) goto LAB_00595922;
        uVar14 = uVar12 + 3;
        iVar5 = vMap->pArray[uVar17];
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar2 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar2 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((iVar5 == 0) || (iVar11 <= (int)uVar14)) {
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          if ((pGVar8 < p_00->pObjs) || (local_6c = 0, p_00->pObjs + p_00->nObjs <= pGVar8))
          goto LAB_005958e4;
        }
        else {
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = p_00->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          local_6c = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
        }
        if (vMap->nSize <= (int)uVar14) goto LAB_00595922;
        uVar12 = uVar12 + 4;
        iVar5 = vMap->pArray[uVar14];
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar2 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar2 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar2 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((iVar5 == 0) || (iVar11 <= (int)uVar12)) {
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          if ((pGVar8 < p_00->pObjs) || (uVar17 = 0, p_00->pObjs + p_00->nObjs <= pGVar8))
          goto LAB_005958e4;
        }
        else {
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
          pGVar3 = p_00->pObjs;
          if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_005958e4;
          uVar17 = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
        }
        uVar2 = *(ulong *)((long)pGVar1 + lVar15 + -8);
        if (((uint)uVar2 >> 0x1d & 1) == 0) {
          if ((uVar2 >> 0x3d & 1) == 0) {
            if ((int)uVar17 < 0) {
LAB_00595960:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            uVar17 = uVar17 | 1;
          }
          else {
            if ((int)uVar16 < 0) goto LAB_00595960;
            uVar16 = uVar16 | 1;
          }
        }
        else if ((uVar2 >> 0x3d & 1) == 0) {
          if ((int)local_6c < 0) goto LAB_00595960;
          local_6c = local_6c | 1;
        }
        else {
          if ((int)iData0 < 0) goto LAB_00595960;
          iData0 = iData0 | 1;
        }
        iVar5 = Gia_ManHashMux(p_00,*(int *)((long)pGVar1 +
                                            (ulong)(((uint)uVar2 & 0x1fffffff) << 2) * -3 + lVar15),
                               uVar16,iData0);
        iVar6 = Gia_ManHashMux(p_00,*(int *)((long)pGVar1 +
                                            (ulong)((*(uint *)((long)pGVar1 + lVar15 + -8) &
                                                    0x1fffffff) << 2) * -3 + lVar15),uVar17,local_6c
                              );
        iVar5 = Gia_ManHashMux(p_00,*(int *)((long)pGVar1 +
                                            (ulong)((*(uint *)((long)pGVar1 + lVar15 + -4) &
                                                    0x1fffffff) << 2) * -3 + lVar15),iVar6,iVar5);
        *(int *)(&pGVar1->field_0x0 + lVar15) = iVar5;
        iVar4 = p->nObjs;
      }
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar13 < iVar4);
  }
  if (uVar12 != vMap->nSize) {
    __assert_fail("iFuncVars == Vec_IntSize(vMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x243,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar15 = 0;
    do {
      iVar11 = pVVar9->pArray[lVar15];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) {
LAB_00595903:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar11;
      if ((int)pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar12 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar1 >> 0x1d & 1 ^
                                    pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value
                              );
      pGVar1->Value = uVar12;
      lVar15 = lVar15 + 1;
      pVVar9 = p->vCos;
    } while (lVar15 < pVVar9->nSize);
  }
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar11 = p->vCis->nSize;
  if (pGVar10->vCis->nSize - pGVar10->nRegs != iVar11 + (~(p->vCos->nSize + iVar11) + p->nObjs) * 4)
  {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x248,"Gia_Man_t *Gia_ManFOFUnfold(Gia_Man_t *, Vec_Int_t *)");
  }
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManFOFUnfold( Gia_Man_t * p, Vec_Int_t * vMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iCtrl0, iCtrl1, iCtrl2, iCtrl3, iMuxA, iMuxB, iFuncVars = 0;
    int VarLimit = 4 * Gia_ManAndNum(p);
    pNew = Gia_ManStart( 9 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl0 = Gia_ManAppendCi(pNew);
        else
            iCtrl0 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl1 = Gia_ManAppendCi(pNew);
        else
            iCtrl1 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl2 = Gia_ManAppendCi(pNew);
        else
            iCtrl2 = 0, Gia_ManAppendCi(pNew);

        if ( Vec_IntEntry(vMap, iFuncVars++) && iFuncVars < VarLimit )
            iCtrl3 = Gia_ManAppendCi(pNew);
        else
            iCtrl3 = 0, Gia_ManAppendCi(pNew);

        if ( Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl0 = Abc_LitNot(iCtrl0);
        else if ( !Gia_ObjFaninC0(pObj) && Gia_ObjFaninC1(pObj) )
            iCtrl1 = Abc_LitNot(iCtrl1);
        else if ( Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl2 = Abc_LitNot(iCtrl2);
        else //if ( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) )
            iCtrl3 = Abc_LitNot(iCtrl3);

        iMuxA       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl1, iCtrl0 );
        iMuxB       = Gia_ManHashMux( pNew, Gia_ObjFanin0(pObj)->Value, iCtrl3, iCtrl2 );
        pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin1(pObj)->Value, iMuxB,  iMuxA );
    }
    assert( iFuncVars == Vec_IntSize(vMap) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + 4 * Gia_ManAndNum(p) );
    return pNew;
}